

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_grow(bitset_t *bitset,size_t newarraysize)

{
  int iVar1;
  ulong new_sz;
  void *pvVar2;
  ulong in_RSI;
  long *in_RDI;
  size_t newcapacity;
  uint64_t *newarray;
  void *in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  if (in_RSI < (ulong)in_RDI[1]) {
    local_1 = false;
  }
  else if (in_RSI < 0x400000000000000) {
    if ((ulong)in_RDI[2] < in_RSI) {
      iVar1 = roaring_leading_zeroes(in_RSI);
      for (new_sz = (0xffffffffffffffffU >> ((byte)iVar1 & 0x3f)) + 1; new_sz < in_RSI;
          new_sz = new_sz << 1) {
      }
      pvVar2 = roaring_realloc(in_stack_ffffffffffffffe0,new_sz);
      if (pvVar2 == (void *)0x0) {
        return false;
      }
      in_RDI[2] = new_sz;
      *in_RDI = (long)pvVar2;
    }
    memset((void *)(*in_RDI + in_RDI[1] * 8),0,(in_RSI - in_RDI[1]) * 8);
    in_RDI[1] = in_RSI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool bitset_grow(bitset_t *bitset, size_t newarraysize) {
    if (newarraysize < bitset->arraysize) {
        return false;
    }
    if (newarraysize > SIZE_MAX / 64) {
        return false;
    }
    if (bitset->capacity < newarraysize) {
        uint64_t *newarray;
        size_t newcapacity = (UINT64_C(0xFFFFFFFFFFFFFFFF) >>
                              roaring_leading_zeroes(newarraysize)) +
                             1;
        while (newcapacity < newarraysize) {
            newcapacity *= 2;
        }
        if ((newarray = (uint64_t *)roaring_realloc(
                 bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
            return false;
        }
        bitset->capacity = newcapacity;
        bitset->array = newarray;
    }
    memset(bitset->array + bitset->arraysize, 0,
           sizeof(uint64_t) * (newarraysize - bitset->arraysize));
    bitset->arraysize = newarraysize;
    return true;  // success!
}